

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_printer.hpp
# Opt level: O2

void __thiscall Args::HelpPrinter::print(HelpPrinter *this,OutStreamType *to)

{
  CmdLine *pCVar1;
  anon_class_24_3_e40bd48b __f;
  pointer ppAVar2;
  pointer ppAVar3;
  size_type sVar4;
  ostream *poVar5;
  ulong uVar6;
  value_type *pvVar7;
  StringList *this_00;
  ulong uVar8;
  bool requiredFlag;
  vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> optional;
  vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> required;
  vector<Args::Command_*,_std::allocator<Args::Command_*>_> commands;
  size_type maxName;
  size_type maxFlag;
  StringList usage_1;
  size_type maxCommand;
  StringList usage;
  function<void_(Args::ArgIface_*)> local_168;
  function<void_(Args::ArgIface_*)> local_148;
  function<void_(Args::ArgIface_*)> local_128;
  function<void_(Args::ArgIface_*)> local_108;
  anon_class_24_3_7b4f0bdb local_e8;
  _Bind<void_(Args::HelpPrinter::*(Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long))(Args::ArgIface_*,_std::basic_ostream<char,_std::char_traits<char>_>_&,_unsigned_long,_unsigned_long)_const>
  local_d0;
  _Bind<void_(Args::HelpPrinter::*(Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long))(Args::ArgIface_*,_std::basic_ostream<char,_std::char_traits<char>_>_&,_unsigned_long,_unsigned_long)_const>
  local_a0;
  _Bind<void_(Args::HelpPrinter::*(Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool))(const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_&,_std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_&,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_&,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_bool)_const>
  local_70;
  
  local_70._M_bound_args.
  super__Tuple_impl<0UL,_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<2UL,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<3UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Head_base<3UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_false>
  ._M_head_impl._M_data =
       (reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>)
       &required;
  required.super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70._M_bound_args.
  super__Tuple_impl<0UL,_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<2UL,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<3UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<4UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Head_base<4UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_false>
  ._M_head_impl._M_data =
       (reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>)
       &optional;
  optional.super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  required.super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  required.super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  optional.super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  optional.super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70._M_bound_args.
  super__Tuple_impl<0UL,_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<2UL,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Head_base<2UL,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_false>
  ._M_head_impl._M_data =
       (reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>)&commands
  ;
  commands.super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  commands.super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  commands.super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70._M_bound_args.
  super__Tuple_impl<0UL,_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<2UL,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<3UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<4UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<5UL,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .super__Head_base<5UL,_std::reference_wrapper<unsigned_long>,_false>._M_head_impl._M_data =
       (reference_wrapper<unsigned_long>)&maxFlag;
  maxFlag = 0;
  local_70._M_bound_args.
  super__Tuple_impl<0UL,_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<2UL,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<3UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<4UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<5UL,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<6UL,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .super__Head_base<6UL,_std::reference_wrapper<unsigned_long>,_false>._M_head_impl._M_data =
       (reference_wrapper<unsigned_long>)&maxName;
  maxName = 0;
  maxCommand = 0;
  local_70._M_f = (offset_in_HelpPrinter_to_subr)sortArg;
  local_70._8_8_ = 0;
  local_70._M_bound_args.
  super__Tuple_impl<0UL,_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<2UL,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<3UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<4UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<5UL,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<6UL,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .super__Tuple_impl<7UL,_std::reference_wrapper<unsigned_long>,_bool>.super__Tuple_impl<8UL,_bool>.
  super__Head_base<8UL,_bool,_false>._M_head_impl = (_Head_base<8UL,_bool,_false>)false;
  local_70._M_bound_args.
  super__Tuple_impl<0UL,_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<2UL,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<3UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<4UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<5UL,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<6UL,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .super__Tuple_impl<7UL,_std::reference_wrapper<unsigned_long>,_bool>.
  super__Head_base<7UL,_std::reference_wrapper<unsigned_long>,_false>._M_head_impl._M_data =
       (reference_wrapper<unsigned_long>)(reference_wrapper<unsigned_long>)&maxCommand;
  local_70._M_bound_args.
  super__Tuple_impl<0UL,_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .super__Head_base<0UL,_Args::HelpPrinter_*,_false>._M_head_impl = this;
  std::
  for_each<__gnu_cxx::__normal_iterator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const*,std::vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>>,std::_Bind<void(Args::HelpPrinter::*(Args::HelpPrinter*,std::_Placeholder<1>,std::reference_wrapper<std::vector<Args::Command*,std::allocator<Args::Command*>>>,std::reference_wrapper<std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,std::reference_wrapper<std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,std::reference_wrapper<unsigned_long>,std::reference_wrapper<unsigned_long>,std::reference_wrapper<unsigned_long>,bool))(std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const&,std::vector<Args::Command*,std::allocator<Args::Command*>>&,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>&,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>&,unsigned_long&,unsigned_long&,unsigned_long&,bool)const>>
            ((_Bind<void_(Args::HelpPrinter::*(Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool))(const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_&,_std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_&,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_&,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_bool)_const>
              *)&usage,
             (this->m_cmdLine->m_args).
             super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->m_cmdLine->m_args).
             super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,&local_70);
  std::
  __sort<__gnu_cxx::__normal_iterator<Args::ArgIface**,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,__gnu_cxx::__ops::_Iter_comp_iter<Args::HelpPrinter::print(std::ostream&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
            (required.super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>.
             _M_impl.super__Vector_impl_data._M_start,
             required.super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  std::
  __sort<__gnu_cxx::__normal_iterator<Args::ArgIface**,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,__gnu_cxx::__ops::_Iter_comp_iter<Args::HelpPrinter::print(std::ostream&)::_lambda(auto:1_const&,auto:2_const&)_2_>>
            (optional.super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>.
             _M_impl.super__Vector_impl_data._M_start,
             optional.super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  std::
  __sort<__gnu_cxx::__normal_iterator<Args::Command**,std::vector<Args::Command*,std::allocator<Args::Command*>>>,__gnu_cxx::__ops::_Iter_comp_iter<Args::HelpPrinter::print(std::ostream&)::_lambda(auto:1_const&,auto:2_const&)_3_>>
            (commands.super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             commands.super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  maxFlag = maxFlag + 2;
  maxName = maxName + 2;
  maxCommand = maxCommand + 2;
  splitToWords(&usage,this,&this->m_appDescription);
  printString(this,to,&usage,0,0,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&usage);
  poVar5 = std::operator<<(to,"\n");
  std::operator<<(poVar5,"\n");
  if (commands.super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      commands.super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    usage_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    usage_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    usage_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&usage_1,&this->m_exeName);
    local_e8.requiredFlag = &requiredFlag;
    requiredFlag = true;
    local_e8.this = this;
    local_e8.usage = &usage_1;
    std::function<void(Args::ArgIface*)>::
    function<Args::HelpPrinter::print(std::ostream&)::_lambda(Args::ArgIface*)_1_,void>
              ((function<void(Args::ArgIface*)> *)&usage,&local_e8);
    ppAVar3 = required.super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppAVar2 = required.super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    std::function<void_(Args::ArgIface_*)>::function
              (&local_148,(function<void_(Args::ArgIface_*)> *)&usage);
    std::
    for_each<__gnu_cxx::__normal_iterator<Args::ArgIface*const*,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,std::function<void(Args::ArgIface*)>>
              (&local_108,
               (__normal_iterator<Args::ArgIface_*const_*,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>
                )ppAVar2,
               (__normal_iterator<Args::ArgIface_*const_*,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>
                )ppAVar3,&local_148);
    std::_Function_base::~_Function_base(&local_108.super__Function_base);
    std::_Function_base::~_Function_base(&local_148.super__Function_base);
    ppAVar3 = optional.super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppAVar2 = optional.super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    requiredFlag = false;
    std::function<void_(Args::ArgIface_*)>::function
              (&local_168,(function<void_(Args::ArgIface_*)> *)&usage);
    std::
    for_each<__gnu_cxx::__normal_iterator<Args::ArgIface*const*,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,std::function<void(Args::ArgIface*)>>
              (&local_128,
               (__normal_iterator<Args::ArgIface_*const_*,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>
                )ppAVar2,
               (__normal_iterator<Args::ArgIface_*const_*,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>
                )ppAVar3,&local_168);
    std::_Function_base::~_Function_base(&local_128.super__Function_base);
    std::_Function_base::~_Function_base(&local_168.super__Function_base);
    std::operator<<(to,"USAGE: ");
    pCVar1 = this->m_cmdLine;
    if ((pCVar1->m_opt & 2) != 0) {
      pvVar7 = (value_type *)c_positional_abi_cxx11_;
      if ((pCVar1->m_positionalDescription)._M_string_length != 0) {
        pvVar7 = &pCVar1->m_positionalDescription;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&usage_1,pvVar7);
    }
    printString(this,to,&usage_1,7,7,1);
    poVar5 = std::operator<<(to,"\n");
    std::operator<<(poVar5,"\n");
    std::_Function_base::~_Function_base((_Function_base *)&usage);
    this_00 = &usage_1;
  }
  else {
    usage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    usage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    usage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&usage,&this->m_exeName);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&usage,(value_type *)c_commands_abi_cxx11_);
    if ((optional.super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>._M_impl.
         super__Vector_impl_data._M_start !=
         optional.super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>._M_impl.
         super__Vector_impl_data._M_finish) ||
       (required.super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        required.super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&usage,(value_type *)c_options_abi_cxx11_);
    }
    pCVar1 = this->m_cmdLine;
    if ((pCVar1->m_opt & 2) != 0) {
      pvVar7 = (value_type *)c_positional_abi_cxx11_;
      if ((pCVar1->m_positionalDescription)._M_string_length != 0) {
        pvVar7 = &pCVar1->m_positionalDescription;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&usage,pvVar7);
    }
    std::operator<<(to,"USAGE: ");
    printString(this,to,&usage,7,7,1);
    poVar5 = std::operator<<(to,"\n");
    std::operator<<(poVar5,"\n");
    __f.this = this;
    __f.to = to;
    __f.maxCommand = &maxCommand;
    std::
    for_each<__gnu_cxx::__normal_iterator<Args::Command*const*,std::vector<Args::Command*,std::allocator<Args::Command*>>>,Args::HelpPrinter::print(std::ostream&)::_lambda(Args::Command*)_1_>
              ((anon_class_24_3_e40bd48b *)&usage_1,
               (__normal_iterator<Args::Command_*const_*,_std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>
                )commands.super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<Args::Command_*const_*,_std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>
                )commands.super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,__f);
    std::operator<<(to,"\n");
    this_00 = &usage;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this_00);
  sVar4 = maxFlag;
  uVar6 = maxName + 6;
  uVar8 = maxFlag + 1;
  if (maxFlag + 1 < uVar6) {
    uVar8 = uVar6;
  }
  if (maxFlag == 1) {
    uVar8 = uVar6;
  }
  if (required.super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      required.super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    poVar5 = std::operator<<(to,"REQUIRED:");
    std::operator<<(poVar5,"\n");
    local_a0._M_f = (offset_in_HelpPrinter_to_subr)printOnlyFor;
    local_a0._8_8_ = 0;
    local_a0._M_bound_args.
    super__Tuple_impl<0UL,_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .
    super__Tuple_impl<2UL,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .super__Tuple_impl<3UL,_unsigned_long,_unsigned_long>.super__Tuple_impl<4UL,_unsigned_long>.
    super__Head_base<4UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<4UL,_unsigned_long,_false>)(_Head_base<4UL,_unsigned_long,_false>)sVar4;
    local_a0._M_bound_args.
    super__Tuple_impl<0UL,_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .
    super__Tuple_impl<2UL,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .super__Tuple_impl<3UL,_unsigned_long,_unsigned_long>.
    super__Head_base<3UL,_unsigned_long,_false>._M_head_impl = uVar8;
    local_a0._M_bound_args.
    super__Tuple_impl<0UL,_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .
    super__Tuple_impl<2UL,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .
    super__Head_base<2UL,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_false>
    ._M_head_impl._M_data =
         (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>)
         (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>)to;
    local_a0._M_bound_args.
    super__Tuple_impl<0UL,_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .super__Head_base<0UL,_Args::HelpPrinter_*,_false>._M_head_impl = this;
    std::
    for_each<__gnu_cxx::__normal_iterator<Args::ArgIface*const*,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,std::_Bind<void(Args::HelpPrinter::*(Args::HelpPrinter*,std::_Placeholder<1>,std::reference_wrapper<std::ostream>,unsigned_long,unsigned_long))(Args::ArgIface*,std::ostream&,unsigned_long,unsigned_long)const>>
              ((_Bind<void_(Args::HelpPrinter::*(Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long))(Args::ArgIface_*,_std::basic_ostream<char,_std::char_traits<char>_>_&,_unsigned_long,_unsigned_long)_const>
                *)&usage,
               (__normal_iterator<Args::ArgIface_*const_*,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>
                )required.super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<Args::ArgIface_*const_*,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>
                )required.super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_a0);
  }
  if (optional.super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      optional.super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    poVar5 = std::operator<<(to,"OPTIONAL:");
    std::operator<<(poVar5,"\n");
    local_d0._M_f = (offset_in_HelpPrinter_to_subr)printOnlyFor;
    local_d0._8_8_ = 0;
    local_d0._M_bound_args.
    super__Tuple_impl<0UL,_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .
    super__Tuple_impl<2UL,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .super__Tuple_impl<3UL,_unsigned_long,_unsigned_long>.super__Tuple_impl<4UL,_unsigned_long>.
    super__Head_base<4UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<4UL,_unsigned_long,_false>)(_Head_base<4UL,_unsigned_long,_false>)sVar4;
    local_d0._M_bound_args.
    super__Tuple_impl<0UL,_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .
    super__Tuple_impl<2UL,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .super__Tuple_impl<3UL,_unsigned_long,_unsigned_long>.
    super__Head_base<3UL,_unsigned_long,_false>._M_head_impl = uVar8;
    local_d0._M_bound_args.
    super__Tuple_impl<0UL,_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .
    super__Tuple_impl<2UL,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .
    super__Head_base<2UL,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_false>
    ._M_head_impl._M_data =
         (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>)
         (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>)to;
    local_d0._M_bound_args.
    super__Tuple_impl<0UL,_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long>
    .super__Head_base<0UL,_Args::HelpPrinter_*,_false>._M_head_impl = this;
    std::
    for_each<__gnu_cxx::__normal_iterator<Args::ArgIface*const*,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,std::_Bind<void(Args::HelpPrinter::*(Args::HelpPrinter*,std::_Placeholder<1>,std::reference_wrapper<std::ostream>,unsigned_long,unsigned_long))(Args::ArgIface*,std::ostream&,unsigned_long,unsigned_long)const>>
              ((_Bind<void_(Args::HelpPrinter::*(Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long))(Args::ArgIface_*,_std::basic_ostream<char,_std::char_traits<char>_>_&,_unsigned_long,_unsigned_long)_const>
                *)&usage,
               (__normal_iterator<Args::ArgIface_*const_*,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>
                )optional.super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<Args::ArgIface_*const_*,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>
                )optional.super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_d0);
  }
  std::ostream::flush();
  std::_Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>::~_Vector_base
            (&commands.super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>);
  std::_Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::~_Vector_base
            (&optional.super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>);
  std::_Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::~_Vector_base
            (&required.super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>);
  return;
}

Assistant:

inline void
HelpPrinter::print( OutStreamType & to )
{
	std::vector< ArgIface* > required;
	std::vector< ArgIface* > optional;
	std::vector< Command* > commands;

	String::size_type maxFlag = 0;
	String::size_type maxName = 0;
	String::size_type maxCommand = 0;

	bool requiredAllOfGroup = false;

	auto f = std::bind( &HelpPrinter::sortArg, this, std::placeholders::_1,
		std::ref( commands ), std::ref( required ),
		std::ref( optional ), std::ref( maxFlag ),
		std::ref( maxName ), std::ref( maxCommand ),
		requiredAllOfGroup );

	std::for_each( m_cmdLine->arguments().cbegin(),
		m_cmdLine->arguments().cend(), f );

	// Sort arguments by name.
	std::sort( required.begin(), required.end(),
		[] ( const auto & a1, const auto & a2 )
			{ return details::argNameLess( a1, a2 ); } );

	std::sort( optional.begin(), optional.end(),
		[] ( const auto & a1, const auto & a2 )
			{ return details::argNameLess( a1, a2 ); } );

	std::sort( commands.begin(), commands.end(),
		[] ( const auto & c1, const auto & c2 )
			{ return details::argNameLess( c1, c2 ); } );

	maxFlag += 2;
	maxName += 2;
	maxCommand += 2;

	printString( to, splitToWords( m_appDescription ), 0, 0, 0 );

	to << "\n" << "\n";

	if( commands.empty() )
	{
		StringList usage;

		usage.push_back( m_exeName );

		bool requiredFlag = true;

		std::function< void ( ArgIface* ) > createUsageAndAppend =
			[ & ] ( ArgIface * arg )
			{
				const StringList words = createUsageString( arg,
					requiredFlag );

				for( const auto & w : details::asConst( words ) )
					usage.push_back( w );
			};

		std::for_each( required.cbegin(), required.cend(),
			createUsageAndAppend );

		requiredFlag = false;

		std::for_each( optional.cbegin(), optional.cend(),
			createUsageAndAppend );

		to << "USAGE: ";

		if( m_cmdLine->parserOptions() & CmdLine::HandlePositionalArguments )
			usage.push_back( m_cmdLine->positionalDescription().empty() ? c_positional :
				m_cmdLine->positionalDescription() );

		printString( to, usage, 7, 7, 1 );

		to << "\n" << "\n";
	}
	else
	{
		StringList usage;

		usage.push_back( m_exeName );
		usage.push_back( c_commands );

		if( !optional.empty() || !required.empty() )
			usage.push_back( c_options );

		if( m_cmdLine->parserOptions() & CmdLine::HandlePositionalArguments )
			usage.push_back( m_cmdLine->positionalDescription().empty() ? c_positional :
				m_cmdLine->positionalDescription() );

		to << "USAGE: ";

		printString( to, usage, 7, 7, 1 );

		to << "\n" << "\n";

		std::for_each( commands.cbegin(), commands.cend(),
			[ & ] ( Command * cmd )
			{
				String::size_type pos = 2;

				to << "  " << cmd->name();

				pos += cmd->name().length();

				if( cmd->isWithValue() )
				{
					to << " <" << cmd->valueSpecifier() << ">";

					pos += 3 + cmd->valueSpecifier().length();
				}

				printString( to, splitToWords( cmd->description() ), pos,
					maxCommand + 1, 0 );

				to << "\n";
			} );

		to << "\n";
	}

	auto printArg = std::bind( &HelpPrinter::printOnlyFor, this,
		std::placeholders::_1, std::ref( to ),
			( maxFlag == 1 ? maxName + 6 : ( maxName + 6 > maxFlag + 1 ?
				maxName + 6 : maxFlag + 1 ) ),
		maxFlag );

	if( !required.empty() )
	{
		to << "REQUIRED:" << "\n";

		std::for_each( required.cbegin(), required.cend(), printArg );
	}

	if( !optional.empty() )
	{
		to << "OPTIONAL:" << "\n";

		std::for_each( optional.cbegin(), optional.cend(), printArg );
	}

	to.flush();
}